

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Statement> __thiscall Parser::throwStatement(Parser *this)

{
  undefined8 this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  ptr<Expression> toThrow;
  undefined1 local_39;
  _Alloc_hider local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  consume(in_RSI);
  local_28 = (pointer)0x0;
  uStack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = match(in_RSI,StatEnd);
  if (!bVar1) {
    expression((Parser *)&stack0xffffffffffffffc8);
    this_00 = uStack_20;
    uStack_20 = _Stack_30._M_pi;
    local_28 = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  consume(in_RSI,StatEnd,"\';\'");
  local_38._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ThrowStatement,std::allocator<ThrowStatement>,std::shared_ptr<Expression>&>
            (&stack0xffffffffffffffd0,(ThrowStatement **)&stack0xffffffffffffffc8,
             (allocator<ThrowStatement> *)&local_39,
             (shared_ptr<Expression> *)&stack0xffffffffffffffd8);
  _Var2._M_pi = _Stack_30._M_pi;
  (this->filepath)._M_dataplus._M_p = local_38._M_p;
  (this->filepath)._M_string_length = 0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
  _Var2._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_20 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::throwStatement() {
    consume();
    ptr<Expression> toThrow;

    if(!match(TokenType::StatEnd)) {
        toThrow = expression();
    }
    consume(TokenType::StatEnd, "';'");
    return make<ThrowStatement>(toThrow);
}